

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O0

c_int update_linsys_solver_matrices_qdldl(qdldl_solver *s,csc *P,csc *A)

{
  QDLDL_int QVar1;
  csc *in_RDX;
  QDLDL_int *unaff_RBX;
  csc *in_RSI;
  QDLDL_int *in_RDI;
  QDLDL_bool *unaff_R12;
  QDLDL_int *unaff_R13;
  QDLDL_float *unaff_R14;
  QDLDL_float *in_stack_ffffffffffffffb8;
  
  update_KKT_P((csc *)in_RDI[0x12],in_RSI,(c_int *)in_RDI[0x13],(c_float)in_RDI[0xc],
               (c_int *)in_RDI[0x10],in_RDI[0x11]);
  update_KKT_A((csc *)in_RDI[0x12],in_RDX,(c_int *)in_RDI[0x14]);
  QVar1 = QDLDL_factor(in_RDI[0x1a],(QDLDL_int *)in_RDI[0x17],(QDLDL_int *)in_RDI[0x18],
                       (QDLDL_float *)in_RDI[7],(QDLDL_int *)in_RDI[0x16],
                       *(QDLDL_int **)(in_RDI[6] + 0x28),in_stack_ffffffffffffffb8,
                       (QDLDL_float *)in_RDX,(QDLDL_float *)in_RSI,in_RDI,unaff_RBX,unaff_R12,
                       unaff_R13,unaff_R14);
  return (long)(int)(uint)(QVar1 < 0);
}

Assistant:

c_int update_linsys_solver_matrices_qdldl(qdldl_solver * s, const csc *P, const csc *A) {

    // Update KKT matrix with new P
    update_KKT_P(s->KKT, P, s->PtoKKT, s->sigma, s->Pdiag_idx, s->Pdiag_n);

    // Update KKT matrix with new A
    update_KKT_A(s->KKT, A, s->AtoKKT);

    return (QDLDL_factor(s->KKT->n, s->KKT->p, s->KKT->i, s->KKT->x,
        s->L->p, s->L->i, s->L->x, s->D, s->Dinv, s->Lnz,
        s->etree, s->bwork, s->iwork, s->fwork) < 0);

}